

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void malloc_conf_init_helper
               (sc_data_t *sc_data,uint *bin_shard_sizes,_Bool initial_call,char **opts_cache,
               char *buf)

{
  _Bool _Var1;
  int iVar2;
  int *piVar3;
  long lVar4;
  percpu_arena_mode_t *ppVar5;
  uintmax_t uVar6;
  byte *pbVar7;
  size_t sVar8;
  ulong uVar9;
  _Bool *p_Var10;
  bool bVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  char cVar13;
  undefined4 uVar14;
  char *pcVar15;
  byte bVar16;
  byte *unaff_R13;
  size_t i;
  size_t sVar17;
  size_t unaff_R14;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  ulong uStack_c0;
  size_t local_a8;
  char *end;
  byte local_91;
  size_t local_90;
  undefined4 local_84;
  size_t local_80;
  size_t vlen_left;
  ulong local_70;
  size_t nshards;
  size_t size_end;
  size_t size_start;
  char **local_50;
  char *local_48;
  sc_data_t *local_40;
  uint *local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000011,initial_call);
  local_91 = !initial_call;
  uVar12 = 0;
  local_50 = opts_cache;
  local_48 = buf;
  local_40 = sc_data;
  local_38 = bin_shard_sizes;
  while( true ) {
    if (uVar12 == 4) {
      log_init_done.repr = true;
      return;
    }
    if ((char)local_84 != '\0') {
      (*(code *)((long)&DAT_00140a28 + (long)(int)(&DAT_00140a28)[uVar12 & 0xffffffff]))();
      return;
    }
    pbVar19 = (byte *)local_50[uVar12];
    if (opt_confirm_conf == true) {
      pbVar7 = pbVar19;
      if (pbVar19 == (byte *)0x0) {
        pbVar7 = (byte *)0x14149b;
      }
      malloc_printf("<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",(ulong)((int)uVar12 + 1),
                    (long)&malloc_conf_init_helper_opts_explain_rel +
                    (long)(int)(&malloc_conf_init_helper_opts_explain_rel)[uVar12],pbVar7);
    }
    if (pbVar19 != (byte *)0x0) break;
LAB_0012f763:
    uVar12 = uVar12 + 1;
  }
LAB_0012e549:
  local_70 = uVar12;
  pbVar7 = pbVar19;
  uVar12 = local_70;
  if (*pbVar7 != 0) {
    bVar11 = false;
    pbVar19 = pbVar7;
LAB_0012e55e:
    sVar8 = (long)pbVar19 - (long)pbVar7;
LAB_0012e562:
    if (bVar11) {
      bVar11 = false;
      local_90 = unaff_R14;
      goto LAB_0012e5ab;
    }
    switch(*pbVar19) {
    case 0:
      pcVar15 = "<jemalloc>: Conf string ends with key\n";
      if (pbVar19 == pbVar7) goto LAB_0012f74e;
      break;
    default:
      pcVar15 = "<jemalloc>: Malformed conf string\n";
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5f:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
      goto switchD_0012e57c_caseD_30;
    case 0x3a:
      goto switchD_0012e57c_caseD_3a;
    }
    malloc_write(pcVar15);
  }
LAB_0012f74e:
  if ((opt_abort_conf == true) && (had_conf_error == '\x01')) {
    malloc_printf("<jemalloc>: Abort (abort_conf:true) on invalid conf value (see above).\n");
    abort();
  }
  goto LAB_0012f763;
LAB_0012e5ab:
  unaff_R14 = local_90;
  sVar17 = (long)pbVar19 + -(long)unaff_R13;
LAB_0012e5b2:
  pbVar20 = pbVar19 + 1;
  if (!bVar11) {
    if (*pbVar19 == 0) goto LAB_0012e5f3;
    if (*pbVar19 != 0x2c) goto code_r0x0012e5c6;
    bVar11 = true;
    pbVar19 = pbVar20;
    local_a8 = sVar17;
    if (*pbVar20 == 0) {
      malloc_write("<jemalloc>: Conf string ends with comma\n");
LAB_0012e5f3:
      bVar11 = true;
      local_a8 = sVar17;
    }
    goto LAB_0012e5ab;
  }
  uVar9 = local_a8;
  sVar17 = unaff_R14;
  if (local_90 != 0xc) {
    uVar12 = local_70;
    if ((char)local_84 != '\0') goto LAB_0012e549;
    if (local_90 == 10) {
      iVar2 = strncmp("abort_conf",(char *)pbVar7,10);
      uVar14 = (undefined4)CONCAT71((int7)((ulong)-(long)unaff_R13 >> 8),1);
      if (iVar2 != 0) goto LAB_0012e670;
      if (local_a8 == 5) {
        iVar2 = strncmp("false",(char *)unaff_R13,5);
        if (iVar2 == 0) {
          opt_abort_conf = false;
          goto LAB_0012eff3;
        }
      }
      else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
        opt_abort_conf = true;
LAB_0012eff3:
        uVar12 = local_70;
        if (opt_confirm_conf != true) goto LAB_0012e549;
        uStack_c0 = 10;
        goto LAB_0012ea43;
      }
      uStack_c0 = 10;
      goto LAB_0012edd7;
    }
    if ((local_90 != 5) || (iVar2 = strncmp("abort",(char *)pbVar7,5), iVar2 != 0))
    goto LAB_0012e66e;
    if (local_a8 == 5) {
      iVar2 = strncmp("false",(char *)unaff_R13,5);
      if (iVar2 == 0) {
        opt_abort = false;
        goto LAB_0012efca;
      }
    }
    else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
      opt_abort = true;
LAB_0012efca:
      uVar12 = local_70;
      if (opt_confirm_conf != true) goto LAB_0012e549;
      uStack_c0 = 5;
      goto LAB_0012ea43;
    }
    uStack_c0 = 5;
    goto LAB_0012edd7;
  }
  iVar2 = strncmp("confirm_conf",(char *)pbVar7,0xc);
  if (iVar2 == 0) {
    if (local_a8 == 5) {
      iVar2 = strncmp("false",(char *)unaff_R13,5);
      if (iVar2 == 0) {
        opt_confirm_conf = false;
        goto LAB_0012ea1a;
      }
    }
    else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
      opt_confirm_conf = true;
LAB_0012ea1a:
      uVar12 = local_70;
      if ((opt_confirm_conf & local_91) != 1) goto LAB_0012e549;
      uStack_c0 = 0xc;
      goto LAB_0012ea43;
    }
    uVar12 = local_70;
    if ((char)local_84 != '\0') goto LAB_0012e549;
    sVar8 = 0xc;
    goto LAB_0012e995;
  }
  uVar12 = local_70;
  if ((char)local_84 != '\0') goto LAB_0012e549;
LAB_0012e66e:
  uVar14 = 0;
LAB_0012e670:
  iVar2 = strncmp("metadata_thp",(char *)pbVar7,unaff_R14);
  if (iVar2 == 0) {
    uVar18 = 0;
    goto LAB_0012e82b;
  }
  if ((unaff_R14 == 6) && (iVar2 = strncmp("retain",(char *)pbVar7,6), iVar2 == 0)) {
    if (local_a8 == 5) {
      iVar2 = strncmp("false",(char *)unaff_R13,5);
      if (iVar2 == 0) {
        _Var1 = false;
LAB_0012ef90:
        p_Var10 = &opt_retain;
LAB_0012ef97:
        *p_Var10 = _Var1;
        uVar12 = local_70;
        if (opt_confirm_conf != true) goto LAB_0012e549;
        uStack_c0 = 6;
        goto LAB_0012ea43;
      }
    }
    else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
      _Var1 = true;
      goto LAB_0012ef90;
    }
LAB_0012ed69:
    uStack_c0 = 6;
    goto LAB_0012edd7;
  }
  iVar2 = strncmp("dss",(char *)pbVar7,unaff_R14);
  if (iVar2 == 0) {
    bVar16 = 1;
    lVar4 = 0;
    goto LAB_0012e8b6;
  }
  if ((unaff_R14 == 7) && (iVar2 = strncmp("narenas",(char *)pbVar7,7), iVar2 == 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    uVar6 = malloc_strtoumax((char *)unaff_R13,&end,0);
    iVar2 = get_errno();
    if ((iVar2 == 0) && ((long)end - (long)unaff_R13 == local_a8)) {
      if (uVar6 != 0) {
        opt_narenas = (uint)uVar6;
        uVar12 = local_70;
        if (opt_confirm_conf == true) {
          uStack_c0 = 7;
          goto LAB_0012eac0;
        }
        goto LAB_0012e549;
      }
      pcVar15 = "Out-of-range conf value";
    }
    else {
      pcVar15 = "Invalid conf value";
    }
    uStack_c0 = 7;
    goto LAB_0012eb7d;
  }
  if (((char)uVar14 != '\0') && (iVar2 = strncmp("bin_shards",(char *)pbVar7,10), iVar2 == 0)) {
    vlen_left = local_a8;
    end = (char *)unaff_R13;
    goto LAB_0012eb08;
  }
  local_80 = CONCAT44(local_80._4_4_,uVar14);
  if (unaff_R14 == 4) {
    iVar2 = strncmp("junk",(char *)pbVar7,4);
    if (iVar2 == 0) {
      if (local_a8 == 5) {
        iVar2 = strncmp("false",(char *)unaff_R13,5);
        if (iVar2 == 0) {
          opt_junk = "false";
          opt_junk_free = false;
          opt_junk_alloc = false;
        }
        else {
          iVar2 = strncmp("alloc",(char *)unaff_R13,5);
          if (iVar2 != 0) goto LAB_0012f0a5;
          opt_junk = "alloc";
          opt_junk_alloc = true;
          opt_junk_free = false;
        }
      }
      else {
        if (local_a8 != 4) {
LAB_0012f0a5:
          uStack_c0 = 4;
          goto LAB_0012f0b5;
        }
        iVar2 = strncmp("true",(char *)unaff_R13,4);
        if (iVar2 == 0) {
          opt_junk = "true";
          opt_junk_free = true;
          opt_junk_alloc = true;
        }
        else {
          iVar2 = strncmp("free",(char *)unaff_R13,4);
          if (iVar2 != 0) goto LAB_0012f0a5;
          opt_junk = "free";
          opt_junk_alloc = false;
          opt_junk_free = true;
        }
      }
      unaff_R14 = local_90;
      uVar12 = local_70;
      if (opt_confirm_conf != true) goto LAB_0012e549;
LAB_0012f64c:
      uStack_c0 = 4;
      goto LAB_0012ea43;
    }
    iVar2 = strncmp("zero",(char *)pbVar7,4);
    unaff_R14 = local_90;
    if (iVar2 != 0) goto LAB_0012f158;
    if (local_a8 == 5) {
      iVar2 = strncmp("false",(char *)unaff_R13,5);
      if (iVar2 == 0) {
        opt_zero = false;
        goto LAB_0012f633;
      }
    }
    else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
      opt_zero = true;
LAB_0012f633:
      uVar12 = local_70;
      if (opt_confirm_conf == true) goto LAB_0012f64c;
      goto LAB_0012e549;
    }
    uStack_c0 = 4;
    sVar17 = unaff_R14;
LAB_0012edd7:
    pcVar15 = "Invalid conf value";
    unaff_R14 = uStack_c0;
    goto LAB_0012f2af;
  }
  if (unaff_R14 == 0xb) {
    iVar2 = strncmp("stats_print",(char *)pbVar7,0xb);
    if (iVar2 != 0) goto LAB_0012f158;
    if (local_a8 == 5) {
      iVar2 = strncmp("false",(char *)unaff_R13,5);
      if (iVar2 == 0) {
        opt_stats_print = false;
        goto LAB_0012f4d3;
      }
    }
    else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
      opt_stats_print = true;
LAB_0012f4d3:
      uVar12 = local_70;
      if (opt_confirm_conf != true) goto LAB_0012e549;
      uStack_c0 = 0xb;
      goto LAB_0012ea43;
    }
    uStack_c0 = 0xb;
    goto LAB_0012edd7;
  }
  if (unaff_R14 != 0x10) {
    if (unaff_R14 == 0xe) {
      iVar2 = strncmp("dirty_decay_ms",(char *)pbVar7,0xe);
      if (iVar2 == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0;
        lVar4 = strtol((char *)unaff_R13,&end,0);
        iVar2 = get_errno();
        if ((iVar2 != 0) || ((long)end - (long)unaff_R13 != local_a8)) {
          uStack_c0 = 0xe;
          goto LAB_0012f0b5;
        }
        unaff_R14 = local_90;
        if (0xffffef39085f50bd < lVar4 - 0x10c6f7a0af41U) {
          opt_dirty_decay_ms = lVar4;
          uVar12 = local_70;
          if (opt_confirm_conf != true) goto LAB_0012e549;
          uStack_c0 = 0xe;
LAB_0012eac0:
          uVar9 = local_a8 & 0xffffffff;
          goto LAB_0012ea43;
        }
        pcVar15 = "Out-of-range conf value";
      }
      else {
        iVar2 = strncmp("muzzy_decay_ms",(char *)pbVar7,0xe);
        unaff_R14 = local_90;
        if (iVar2 != 0) goto LAB_0012f158;
        piVar3 = __errno_location();
        *piVar3 = 0;
        lVar4 = strtol((char *)unaff_R13,&end,0);
        iVar2 = get_errno();
        if ((iVar2 == 0) && ((long)end - (long)unaff_R13 == local_a8)) {
          if (0xffffef39085f50bd < lVar4 - 0x10c6f7a0af41U) {
            opt_muzzy_decay_ms = lVar4;
            uVar12 = local_70;
            if (opt_confirm_conf == true) {
              uStack_c0 = 0xe;
              goto LAB_0012eac0;
            }
            goto LAB_0012e549;
          }
          pcVar15 = "Out-of-range conf value";
        }
        else {
          pcVar15 = "Invalid conf value";
        }
      }
      uStack_c0 = 0xe;
      goto LAB_0012eb7d;
    }
    if (unaff_R14 == 6) {
      iVar2 = strncmp("tcache",(char *)pbVar7,6);
      if (iVar2 == 0) {
        if (local_a8 == 5) {
          iVar2 = strncmp("false",(char *)unaff_R13,5);
          if (iVar2 == 0) {
            _Var1 = false;
            goto LAB_0012f4c5;
          }
        }
        else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
          _Var1 = true;
LAB_0012f4c5:
          p_Var10 = &opt_tcache;
          goto LAB_0012ef97;
        }
        goto LAB_0012ed69;
      }
    }
    else if (unaff_R14 == 0x18) {
      iVar2 = strncmp("lg_extent_max_active_fit",(char *)pbVar7,0x18);
      if (iVar2 == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0;
        uVar6 = malloc_strtoumax((char *)unaff_R13,&end,0);
        iVar2 = get_errno();
        if ((iVar2 == 0) && ((long)end - (long)unaff_R13 == local_a8)) {
          if (uVar6 < 0x41) {
            opt_lg_extent_max_active_fit = uVar6;
            uVar12 = local_70;
            if (opt_confirm_conf == true) {
              uStack_c0 = 0x18;
              goto LAB_0012eac0;
            }
            goto LAB_0012e549;
          }
          pcVar15 = "Out-of-range conf value";
        }
        else {
          pcVar15 = "Invalid conf value";
        }
        uStack_c0 = 0x18;
        goto LAB_0012eb7d;
      }
    }
    else if (unaff_R14 == 0x12) {
      iVar2 = strncmp("oversize_threshold",(char *)pbVar7,0x12);
      if (iVar2 == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0;
        uVar6 = malloc_strtoumax((char *)unaff_R13,&end,0);
        iVar2 = get_errno();
        if ((iVar2 == 0) && ((long)end - (long)unaff_R13 == local_a8)) {
          if (uVar6 < 0x7000000000000001) {
            opt_oversize_threshold = uVar6;
            uVar12 = local_70;
            if (opt_confirm_conf == true) {
              uStack_c0 = 0x12;
              goto LAB_0012eac0;
            }
            goto LAB_0012e549;
          }
          pcVar15 = "Out-of-range conf value";
        }
        else {
          pcVar15 = "Invalid conf value";
        }
        uStack_c0 = 0x12;
        goto LAB_0012eb7d;
      }
    }
    else if ((unaff_R14 == 0xd) && (iVar2 = strncmp("lg_tcache_max",(char *)pbVar7,0xd), iVar2 == 0)
            ) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      lVar4 = strtol((char *)unaff_R13,&end,0);
      iVar2 = get_errno();
      if ((iVar2 == 0) && ((long)end - (long)unaff_R13 == local_a8)) {
        if (0xffffffffffffffbe < lVar4 - 0x40U) {
          opt_lg_tcache_max = lVar4;
          uVar12 = local_70;
          if (opt_confirm_conf == true) {
            uStack_c0 = 0xd;
            goto LAB_0012eac0;
          }
          goto LAB_0012e549;
        }
        pcVar15 = "Out-of-range conf value";
      }
      else {
        pcVar15 = "Invalid conf value";
      }
      uStack_c0 = 0xd;
LAB_0012eb7d:
      malloc_conf_error(pcVar15,(char *)pbVar7,uStack_c0,(char *)unaff_R13,local_a8);
      uVar12 = local_70;
      goto LAB_0012e549;
    }
LAB_0012f158:
    iVar2 = strncmp("percpu_arena",(char *)pbVar7,unaff_R14);
    if (iVar2 == 0) {
      uVar18 = 0;
      goto LAB_0012f1e4;
    }
    sVar17 = unaff_R14;
    if (unaff_R14 == 0x16) {
      iVar2 = strncmp("max_background_threads",(char *)pbVar7,0x16);
      cVar13 = (char)local_80;
      if (iVar2 == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0;
        uVar6 = malloc_strtoumax((char *)unaff_R13,&end,0);
        iVar2 = get_errno();
        if ((iVar2 != 0) || ((long)end - (long)unaff_R13 != local_a8)) {
          uStack_c0 = 0x16;
          goto LAB_0012edd7;
        }
        sVar8 = 1;
        if ((uVar6 == 0) || (sVar8 = uVar6, uVar6 <= opt_max_background_threads)) {
          opt_max_background_threads = sVar8;
        }
        uVar12 = local_70;
        if (opt_confirm_conf != true) goto LAB_0012e549;
        uStack_c0 = 0x16;
        goto LAB_0012f32f;
      }
    }
    else {
      cVar13 = (char)local_80;
      if ((unaff_R14 == 0x11) &&
         (iVar2 = strncmp("background_thread",(char *)pbVar7,0x11), iVar2 == 0)) {
        if (local_a8 == 5) {
          iVar2 = strncmp("false",(char *)unaff_R13,5);
          if (iVar2 == 0) {
            opt_background_thread = false;
            goto LAB_0012f65c;
          }
        }
        else if ((local_a8 == 4) && (iVar2 = strncmp("true",(char *)unaff_R13,4), iVar2 == 0)) {
          opt_background_thread = true;
LAB_0012f65c:
          uVar12 = local_70;
          if (opt_confirm_conf != true) goto LAB_0012e549;
          uStack_c0 = 0x11;
          goto LAB_0012ea43;
        }
        uStack_c0 = 0x11;
        goto LAB_0012edd7;
      }
    }
    if ((cVar13 != '\0') && (iVar2 = strncmp("slab_sizes",(char *)pbVar7,10), iVar2 == 0)) {
      vlen_left = local_a8;
      end = (char *)unaff_R13;
      goto LAB_0012f2c9;
    }
    if (unaff_R14 == 3) {
      iVar2 = *pbVar7 - 0x74;
      if ((iVar2 == 0) && (iVar2 = pbVar7[1] - 0x68, iVar2 == 0)) {
        iVar2 = 0x70 - (uint)pbVar7[2];
      }
      else {
        iVar2 = -iVar2;
      }
      if (iVar2 == 0) {
        uVar18 = 0;
        goto LAB_0012f3ab;
      }
    }
    pcVar15 = "Invalid conf pair";
    goto LAB_0012f2af;
  }
  iVar2 = strncmp("stats_print_opts",(char *)pbVar7,0x10);
  if (iVar2 != 0) goto LAB_0012f158;
  local_80 = strlen(opt_stats_print_opts);
  for (sVar17 = 0; local_a8 != sVar17; sVar17 = sVar17 + 1) {
    bVar16 = unaff_R13[sVar17];
    if (((bVar16 - 0x4a < 0x2f) && ((0x400c2d800001U >> ((ulong)(bVar16 - 0x4a) & 0x3f) & 1) != 0))
       && (pcVar15 = strchr(opt_stats_print_opts,(uint)bVar16), pcVar15 == (char *)0x0)) {
      opt_stats_print_opts[local_80] = bVar16;
      opt_stats_print_opts[local_80 + 1] = '\0';
      local_80 = local_80 + 1;
    }
    unaff_R14 = local_90;
  }
  uVar12 = local_70;
  if (opt_confirm_conf == true) {
    uStack_c0 = 0x10;
    goto LAB_0012ea43;
  }
  goto LAB_0012e549;
code_r0x0012e5c6:
  sVar17 = sVar17 + 1;
  bVar11 = false;
  pbVar19 = pbVar20;
  goto LAB_0012e5b2;
LAB_0012e82b:
  if (uVar18 == 3) goto LAB_0012f20d;
  iVar2 = strncmp(metadata_thp_mode_names[uVar18],(char *)unaff_R13,local_a8);
  if (iVar2 == 0) {
    ppVar5 = &opt_metadata_thp;
    goto LAB_0012e916;
  }
  uVar18 = uVar18 + 1;
  goto LAB_0012e82b;
LAB_0012e8b6:
  sVar8 = unaff_R14;
  if (lVar4 == 3) goto LAB_0012e995;
  iVar2 = strncmp(dss_prec_names[lVar4],(char *)unaff_R13,local_a8);
  if (iVar2 == 0) {
    _Var1 = extent_dss_prec_set((dss_prec_t)lVar4);
    if (!_Var1) {
      opt_dss = dss_prec_names[lVar4];
      uVar12 = local_70;
      if ((bVar16 & opt_confirm_conf) != 1) goto LAB_0012e549;
      goto LAB_0012e938;
    }
    malloc_conf_error("Error setting dss",(char *)pbVar7,unaff_R14,(char *)unaff_R13,local_a8);
    bVar16 = 0;
  }
  lVar4 = lVar4 + 1;
  goto LAB_0012e8b6;
LAB_0012e995:
  malloc_conf_error("Invalid conf value",(char *)pbVar7,sVar8,(char *)unaff_R13,local_a8);
  uVar12 = local_70;
  goto LAB_0012e549;
  while (vlen_left != 0) {
LAB_0012eb08:
    _Var1 = malloc_conf_multi_sizes_next(&end,&vlen_left,&size_start,&size_end,&nshards);
    if ((_Var1) ||
       (_Var1 = bin_update_shard_size
                          (local_38,size_start,size_end,CONCAT44(nshards._4_4_,(int)nshards)), _Var1
       )) {
      pcVar15 = "Invalid settings for bin_shards";
      goto LAB_0012f2af;
    }
  }
  uVar12 = local_70;
  if (opt_confirm_conf != true) goto LAB_0012e549;
LAB_0012f325:
  uStack_c0 = unaff_R14 & 0xffffffff;
LAB_0012f32f:
  uVar9 = local_a8 & 0xffffffff;
LAB_0012ea43:
  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",uStack_c0,pbVar7,uVar9,unaff_R13);
  uVar12 = local_70;
  goto LAB_0012e549;
LAB_0012f1e4:
  if (uVar18 == 3) goto LAB_0012f20d;
  iVar2 = strncmp(percpu_arena_mode_names[uVar18],(char *)unaff_R13,local_a8);
  if (iVar2 != 0) goto code_r0x0012f208;
  ppVar5 = &opt_percpu_arena;
LAB_0012e916:
  *ppVar5 = (metadata_thp_mode_t)uVar18;
  unaff_R14 = local_90;
  uVar12 = local_70;
  if ((uVar18 < 3) && (opt_confirm_conf != false)) {
LAB_0012e938:
    uStack_c0 = unaff_R14 & 0xffffffff;
    goto LAB_0012ea43;
  }
  goto LAB_0012e549;
LAB_0012f20d:
  pcVar15 = "Invalid conf value";
  unaff_R14 = local_90;
  sVar17 = local_90;
LAB_0012f2af:
  malloc_conf_error(pcVar15,(char *)pbVar7,unaff_R14,(char *)unaff_R13,local_a8);
  unaff_R14 = sVar17;
  uVar12 = local_70;
  goto LAB_0012e549;
code_r0x0012f208:
  uVar18 = uVar18 + 1;
  goto LAB_0012f1e4;
  while (sc_data_update_slab_size(local_40,size_start,size_end,(int)nshards), vlen_left != 0) {
LAB_0012f2c9:
    _Var1 = malloc_conf_multi_sizes_next(&end,&vlen_left,&size_start,&size_end,&nshards);
    if (_Var1) {
      pcVar15 = "Invalid settings for slab_sizes";
      goto LAB_0012f2af;
    }
  }
  uVar12 = local_70;
  if (_Var1 || opt_confirm_conf != true) goto LAB_0012e549;
  goto LAB_0012f325;
LAB_0012f3ab:
  if (uVar18 == 3) goto LAB_0012f3fe;
  iVar2 = strncmp(thp_mode_names[uVar18],(char *)unaff_R13,local_a8);
  if (iVar2 == 0) {
    opt_thp = (thp_mode_t)uVar18;
    unaff_R14 = local_90;
    uVar12 = local_70;
    if ((2 < uVar18) || (opt_confirm_conf == false)) goto LAB_0012e549;
    uStack_c0 = 3;
    goto LAB_0012ea43;
  }
  uVar18 = uVar18 + 1;
  goto LAB_0012f3ab;
LAB_0012f3fe:
  uStack_c0 = 3;
LAB_0012f0b5:
  malloc_conf_error("Invalid conf value",(char *)pbVar7,uStack_c0,(char *)unaff_R13,local_a8);
  unaff_R14 = local_90;
  uVar12 = local_70;
  goto LAB_0012e549;
switchD_0012e57c_caseD_3a:
  unaff_R13 = pbVar19 + 1;
  bVar11 = true;
  unaff_R14 = sVar8;
  pbVar19 = unaff_R13;
  goto LAB_0012e55e;
switchD_0012e57c_caseD_30:
  pbVar19 = pbVar19 + 1;
  sVar8 = sVar8 + 1;
  bVar11 = false;
  goto LAB_0012e562;
}

Assistant:

static void
malloc_conf_init_helper(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    bool initial_call, const char *opts_cache[MALLOC_CONF_NSOURCES],
    char buf[PATH_MAX + 1]) {
	static const char *opts_explain[MALLOC_CONF_NSOURCES] = {
		"string specified via --with-malloc-conf",
		"string pointed to by the global variable malloc_conf",
		"\"name\" of the file referenced by the symbolic link named "
		    "/etc/malloc.conf",
		"value of the environment variable MALLOC_CONF"
	};
	unsigned i;
	const char *opts, *k, *v;
	size_t klen, vlen;

	for (i = 0; i < MALLOC_CONF_NSOURCES; i++) {
		/* Get runtime configuration. */
		if (initial_call) {
			opts_cache[i] = obtain_malloc_conf(i, buf);
		}
		opts = opts_cache[i];
		if (!initial_call && opt_confirm_conf) {
			malloc_printf(
			    "<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",
			    i + 1, opts_explain[i], opts != NULL ? opts : "");
		}
		if (opts == NULL) {
			continue;
		}

		while (*opts != '\0' && !malloc_conf_next(&opts, &k, &klen, &v,
		    &vlen)) {

#define CONF_ERROR(msg, k, klen, v, vlen)				\
			if (!initial_call) {				\
				malloc_conf_error(			\
				    msg, k, klen, v, vlen);		\
				cur_opt_valid = false;			\
			}
#define CONF_CONTINUE	{						\
				if (!initial_call && opt_confirm_conf	\
				    && cur_opt_valid) {			\
					malloc_printf("<jemalloc>: Set "\
					    "conf value: %.*s:%.*s\n",	\
					    (int)klen, k, (int)vlen, v);\
				}					\
				continue;				\
			}
#define CONF_MATCH(n)							\
	(sizeof(n)-1 == klen && strncmp(n, k, klen) == 0)
#define CONF_MATCH_VALUE(n)						\
	(sizeof(n)-1 == vlen && strncmp(n, v, vlen) == 0)
#define CONF_HANDLE_BOOL(o, n)						\
			if (CONF_MATCH(n)) {				\
				if (CONF_MATCH_VALUE("true")) {		\
					o = true;			\
				} else if (CONF_MATCH_VALUE("false")) {	\
					o = false;			\
				} else {				\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				}					\
				CONF_CONTINUE;				\
			}
      /*
       * One of the CONF_MIN macros below expands, in one of the use points,
       * to "unsigned integer < 0", which is always false, triggering the
       * GCC -Wtype-limits warning, which we disable here and re-enable below.
       */
      JEMALLOC_DIAGNOSTIC_PUSH
      JEMALLOC_DIAGNOSTIC_IGNORE_TYPE_LIMITS

#define CONF_DONT_CHECK_MIN(um, min)	false
#define CONF_CHECK_MIN(um, min)	((um) < (min))
#define CONF_DONT_CHECK_MAX(um, max)	false
#define CONF_CHECK_MAX(um, max)	((um) > (max))
#define CONF_HANDLE_T_U(t, o, n, min, max, check_min, check_max, clip)	\
			if (CONF_MATCH(n)) {				\
				uintmax_t um;				\
				char *end;				\
									\
				set_errno(0);				\
				um = malloc_strtoumax(v, &end, 0);	\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (clip) {			\
					if (check_min(um, (t)(min))) {	\
						o = (t)(min);		\
					} else if (			\
					    check_max(um, (t)(max))) {	\
						o = (t)(max);		\
					} else {			\
						o = (t)um;		\
					}				\
				} else {				\
					if (check_min(um, (t)(min)) ||	\
					    check_max(um, (t)(max))) {	\
						CONF_ERROR(		\
						    "Out-of-range "	\
						    "conf value",	\
						    k, klen, v, vlen);	\
					} else {			\
						o = (t)um;		\
					}				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_UNSIGNED(o, n, min, max, check_min, check_max,	\
    clip)								\
			CONF_HANDLE_T_U(unsigned, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_SIZE_T(o, n, min, max, check_min, check_max, clip)	\
			CONF_HANDLE_T_U(size_t, o, n, min, max,		\
			    check_min, check_max, clip)
#define CONF_HANDLE_SSIZE_T(o, n, min, max)				\
			if (CONF_MATCH(n)) {				\
				long l;					\
				char *end;				\
									\
				set_errno(0);				\
				l = strtol(v, &end, 0);			\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (l < (ssize_t)(min) || l >	\
				    (ssize_t)(max)) {			\
					CONF_ERROR(			\
					    "Out-of-range conf value",	\
					    k, klen, v, vlen);		\
				} else {				\
					o = l;				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_CHAR_P(o, n, d)					\
			if (CONF_MATCH(n)) {				\
				size_t cpylen = (vlen <=		\
				    sizeof(o)-1) ? vlen :		\
				    sizeof(o)-1;			\
				strncpy(o, v, cpylen);			\
				o[cpylen] = '\0';			\
				CONF_CONTINUE;				\
			}

			bool cur_opt_valid = true;

			CONF_HANDLE_BOOL(opt_confirm_conf, "confirm_conf")
			if (initial_call) {
				continue;
			}

			CONF_HANDLE_BOOL(opt_abort, "abort")
			CONF_HANDLE_BOOL(opt_abort_conf, "abort_conf")
			if (strncmp("metadata_thp", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < metadata_thp_mode_limit; i++) {
					if (strncmp(metadata_thp_mode_names[i],
					    v, vlen) == 0) {
						opt_metadata_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_retain, "retain")
			if (strncmp("dss", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < dss_prec_limit; i++) {
					if (strncmp(dss_prec_names[i], v, vlen)
					    == 0) {
						if (extent_dss_prec_set(i)) {
							CONF_ERROR(
							    "Error setting dss",
							    k, klen, v, vlen);
						} else {
							opt_dss =
							    dss_prec_names[i];
							match = true;
							break;
						}
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_UNSIGNED(opt_narenas, "narenas", 1,
			    UINT_MAX, CONF_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    false)
			if (CONF_MATCH("bin_shards")) {
				const char *bin_shards_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t size_start;
					size_t size_end;
					size_t nshards;
					bool err = malloc_conf_multi_sizes_next(
					    &bin_shards_segment_cur, &vlen_left,
					    &size_start, &size_end, &nshards);
					if (err || bin_update_shard_size(
					    bin_shard_sizes, size_start,
					    size_end, nshards)) {
						CONF_ERROR(
						    "Invalid settings for "
						    "bin_shards", k, klen, v,
						    vlen);
						break;
					}
				} while (vlen_left > 0);
				CONF_CONTINUE;
			}
			CONF_HANDLE_SSIZE_T(opt_dirty_decay_ms,
			    "dirty_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_SSIZE_T(opt_muzzy_decay_ms,
			    "muzzy_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_BOOL(opt_stats_print, "stats_print")
			if (CONF_MATCH("stats_print_opts")) {
				init_opt_stats_print_opts(v, vlen);
				CONF_CONTINUE;
			}
			if (config_fill) {
				if (CONF_MATCH("junk")) {
					if (CONF_MATCH_VALUE("true")) {
						opt_junk = "true";
						opt_junk_alloc = opt_junk_free =
						    true;
					} else if (CONF_MATCH_VALUE("false")) {
						opt_junk = "false";
						opt_junk_alloc = opt_junk_free =
						    false;
					} else if (CONF_MATCH_VALUE("alloc")) {
						opt_junk = "alloc";
						opt_junk_alloc = true;
						opt_junk_free = false;
					} else if (CONF_MATCH_VALUE("free")) {
						opt_junk = "free";
						opt_junk_alloc = false;
						opt_junk_free = true;
					} else {
						CONF_ERROR(
						    "Invalid conf value",
						    k, klen, v, vlen);
					}
					CONF_CONTINUE;
				}
				CONF_HANDLE_BOOL(opt_zero, "zero")
			}
			if (config_utrace) {
				CONF_HANDLE_BOOL(opt_utrace, "utrace")
			}
			if (config_xmalloc) {
				CONF_HANDLE_BOOL(opt_xmalloc, "xmalloc")
			}
			CONF_HANDLE_BOOL(opt_tcache, "tcache")
			CONF_HANDLE_SSIZE_T(opt_lg_tcache_max, "lg_tcache_max",
			    -1, (sizeof(size_t) << 3) - 1)

			/*
			 * The runtime option of oversize_threshold remains
			 * undocumented.  It may be tweaked in the next major
			 * release (6.0).  The default value 8M is rather
			 * conservative / safe.  Tuning it further down may
			 * improve fragmentation a bit more, but may also cause
			 * contention on the huge arena.
			 */
			CONF_HANDLE_SIZE_T(opt_oversize_threshold,
			    "oversize_threshold", 0, SC_LARGE_MAXCLASS,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX, false)
			CONF_HANDLE_SIZE_T(opt_lg_extent_max_active_fit,
			    "lg_extent_max_active_fit", 0,
			    (sizeof(size_t) << 3), CONF_DONT_CHECK_MIN,
			    CONF_CHECK_MAX, false)

			if (strncmp("percpu_arena", k, klen) == 0) {
				bool match = false;
				for (int i = percpu_arena_mode_names_base; i <
				    percpu_arena_mode_names_limit; i++) {
					if (strncmp(percpu_arena_mode_names[i],
					    v, vlen) == 0) {
						if (!have_percpu_arena) {
							CONF_ERROR(
							    "No getcpu support",
							    k, klen, v, vlen);
						}
						opt_percpu_arena = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_background_thread,
			    "background_thread");
			CONF_HANDLE_SIZE_T(opt_max_background_threads,
					   "max_background_threads", 1,
					   opt_max_background_threads,
					   CONF_CHECK_MIN, CONF_CHECK_MAX,
					   true);
			if (CONF_MATCH("slab_sizes")) {
				bool err;
				const char *slab_size_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t slab_start;
					size_t slab_end;
					size_t pgs;
					err = malloc_conf_multi_sizes_next(
					    &slab_size_segment_cur,
					    &vlen_left, &slab_start, &slab_end,
					    &pgs);
					if (!err) {
						sc_data_update_slab_size(
						    sc_data, slab_start,
						    slab_end, (int)pgs);
					} else {
						CONF_ERROR("Invalid settings "
						    "for slab_sizes",
						    k, klen, v, vlen);
					}
				} while (!err && vlen_left > 0);
				CONF_CONTINUE;
			}
			if (config_prof) {
				CONF_HANDLE_BOOL(opt_prof, "prof")
				CONF_HANDLE_CHAR_P(opt_prof_prefix,
				    "prof_prefix", "jeprof")
				CONF_HANDLE_BOOL(opt_prof_active, "prof_active")
				CONF_HANDLE_BOOL(opt_prof_thread_active_init,
				    "prof_thread_active_init")
				CONF_HANDLE_SIZE_T(opt_lg_prof_sample,
				    "lg_prof_sample", 0, (sizeof(uint64_t) << 3)
				    - 1, CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
				    true)
				CONF_HANDLE_BOOL(opt_prof_accum, "prof_accum")
				CONF_HANDLE_SSIZE_T(opt_lg_prof_interval,
				    "lg_prof_interval", -1,
				    (sizeof(uint64_t) << 3) - 1)
				CONF_HANDLE_BOOL(opt_prof_gdump, "prof_gdump")
				CONF_HANDLE_BOOL(opt_prof_final, "prof_final")
				CONF_HANDLE_BOOL(opt_prof_leak, "prof_leak")
				CONF_HANDLE_BOOL(opt_prof_log, "prof_log")
			}
			if (config_log) {
				if (CONF_MATCH("log")) {
					size_t cpylen = (
					    vlen <= sizeof(log_var_names) ?
					    vlen : sizeof(log_var_names) - 1);
					strncpy(log_var_names, v, cpylen);
					log_var_names[cpylen] = '\0';
					CONF_CONTINUE;
				}
			}
			if (CONF_MATCH("thp")) {
				bool match = false;
				for (int i = 0; i < thp_mode_names_limit; i++) {
					if (strncmp(thp_mode_names[i],v, vlen)
					    == 0) {
						if (!have_madvise_huge) {
							CONF_ERROR(
							    "No THP support",
							    k, klen, v, vlen);
						}
						opt_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_ERROR("Invalid conf pair", k, klen, v, vlen);
#undef CONF_ERROR
#undef CONF_CONTINUE
#undef CONF_MATCH
#undef CONF_MATCH_VALUE
#undef CONF_HANDLE_BOOL
#undef CONF_DONT_CHECK_MIN
#undef CONF_CHECK_MIN
#undef CONF_DONT_CHECK_MAX
#undef CONF_CHECK_MAX
#undef CONF_HANDLE_T_U
#undef CONF_HANDLE_UNSIGNED
#undef CONF_HANDLE_SIZE_T
#undef CONF_HANDLE_SSIZE_T
#undef CONF_HANDLE_CHAR_P
    /* Re-enable diagnostic "-Wtype-limits" */
    JEMALLOC_DIAGNOSTIC_POP
		}
		if (opt_abort_conf && had_conf_error) {
			malloc_abort_invalid_conf();
		}
	}
	atomic_store_b(&log_init_done, true, ATOMIC_RELEASE);
}